

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication_p.h
# Opt level: O2

QGestureManager * QGestureManager::instance(InstanceCreation ic)

{
  QApplicationPrivate *pQVar1;
  QGestureManager *this;
  
  pQVar1 = QApplicationPrivate::self;
  if (QApplicationPrivate::self == (QApplicationPrivate *)0x0) {
    this = (QGestureManager *)0x0;
  }
  else {
    this = QApplicationPrivate::self->gestureManager;
    if (ic == ForceCreation && this == (QGestureManager *)0x0) {
      this = (QGestureManager *)operator_new(0x68);
      QGestureManager((QGestureManager *)this,QCoreApplication::self);
      pQVar1->gestureManager = this;
    }
  }
  return this;
}

Assistant:

static QApplicationPrivate *instance() { return self; }